

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O1

int __thiscall
QTlsBackend::dhParametersFromDer(QTlsBackend *this,QByteArray *derData,QByteArray *data)

{
  QDebug QVar1;
  QLoggingCategory *pQVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QArrayData *local_78;
  undefined8 *local_70;
  undefined4 local_60;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined4 local_4c;
  char *local_48;
  QDebug local_40;
  QArrayData *local_38 [3];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QtPrivateLogging::lcSsl();
  if (((pQVar2->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
    local_48 = pQVar2->name;
    local_60 = 2;
    local_5c = 0;
    uStack_54 = 0;
    local_4c = 0;
    QMessageLogger::warning();
    QVar1.stream = local_40.stream;
    QVar3.m_data = (storage_type *)0xb;
    QVar3.m_size = (qsizetype)local_38;
    QString::fromUtf8(QVar3);
    QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_38);
    if (local_38[0] != (QArrayData *)0x0) {
      LOCK();
      (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_38[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_40.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_40.stream,' ');
    }
    (**(code **)(*(long *)this + 0x90))(&local_78,this);
    if (local_70 == (undefined8 *)0x0) {
      local_70 = &QString::_empty;
    }
    QDebug::putString((QChar *)&local_40,(ulong)local_70);
    if (*(QTextStream *)(local_40.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_40.stream,' ');
    }
    QVar1.stream = local_40.stream;
    QVar4.m_data = (storage_type *)0x3a;
    QVar4.m_size = (qsizetype)local_38;
    QString::fromUtf8(QVar4);
    QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_38);
    if (local_38[0] != (QArrayData *)0x0) {
      LOCK();
      (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_38[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_40.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_40.stream,' ');
    }
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,0x10);
      }
    }
    QDebug::~QDebug(&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int QTlsBackend::dhParametersFromDer(const QByteArray &derData, QByteArray *data) const
{
    Q_UNUSED(derData);
    Q_UNUSED(data);
    REPORT_MISSING_SUPPORT("does not support QSslDiffieHellmanParameters in DER format");
    return {};
}